

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ContinuousAssignSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ContinuousAssignSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DriveStrengthSyntax*,slang::syntax::TimingControlSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DriveStrengthSyntax **args_2,TimingControlSyntax **args_3,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_4,Token *args_5)

{
  Token semi;
  Token assign;
  ContinuousAssignSyntax *pCVar1;
  ContinuousAssignSyntax *in_RCX;
  long in_RDX;
  Info *in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_R8;
  DriveStrengthSyntax *in_R9;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *unaff_retaddr;
  undefined8 in_stack_00000008;
  Info *in_stack_00000010;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pCVar1 = (ContinuousAssignSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  assign.info = in_RSI;
  assign.kind = (short)in_RDX;
  assign._2_1_ = (char)((ulong)in_RDX >> 0x10);
  assign.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  assign.rawLen = (int)((ulong)in_RDX >> 0x20);
  semi.info = in_stack_00000010;
  semi._0_8_ = in_stack_00000008;
  slang::syntax::ContinuousAssignSyntax::ContinuousAssignSyntax
            (in_RCX,in_R8,assign,in_R9,*(TimingControlSyntax **)(in_RDX + 8),unaff_retaddr,semi);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }